

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_exception_primitive_onDo
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  int iVar1;
  sysbvm_stackFrameLandingPadRecord_t landingPadRecord;
  sysbvm_tuple_t local_140;
  sysbvm_stackFrameRecord_t local_138;
  undefined8 local_128;
  sysbvm_tuple_t *local_120;
  sysbvm_stackFrameRecord_t local_118;
  sysbvm_tuple_t local_108;
  sysbvm_tuple_t local_f0;
  sysbvm_tuple_t local_e8;
  __jmp_buf_tag local_e0;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_120 = &local_140;
  local_140 = 0;
  local_138.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_138.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_138._12_4_ = 0;
  local_128 = 1;
  sysbvm_stackFrame_pushRecord(&local_138);
  memset(&local_118,0,0x100);
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  local_108 = arguments[1];
  local_f0 = arguments[2];
  sysbvm_stackFrame_pushRecord(&local_118);
  iVar1 = _setjmp(&local_e0);
  if (iVar1 == 0) {
    local_e8 = sysbvm_function_apply(context,*arguments,0,(sysbvm_tuple_t *)0x0,0);
  }
  local_140 = local_e8;
  sysbvm_stackFrame_popRecord(&local_118);
  sysbvm_stackFrame_popRecord(&local_138);
  return local_140;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_onDo(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *body = arguments + 0;
    sysbvm_tuple_t *exceptionType = arguments + 1;
    sysbvm_tuple_t *exceptionAction = arguments + 2;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameLandingPadRecord_t landingPadRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD,
        .exceptionFilter = *exceptionType,
        .action = *exceptionAction
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&landingPadRecord);

    if(!_setjmp(landingPadRecord.jmpbuffer))
        gcFrame.result = sysbvm_function_apply0(context, *body);
    else
        gcFrame.result = landingPadRecord.actionResult;

    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&landingPadRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}